

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O2

void setup_block_rdmult(AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize,
                       AQ_MODE aq_mode,MB_MODE_INFO *mbmi)

{
  int *rdmult;
  aom_tune_metric aVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined7 in_register_00000089;
  
  iVar3 = (cpi->rd).RDMULT;
  rdmult = &x->rdmult;
  x->rdmult = iVar3;
  iVar4 = (int)CONCAT71(in_register_00000089,aq_mode);
  if (iVar4 == 3) {
    if ((*(ushort *)&mbmi->field_0xa7 & 7) - 3 < 0xfffffffe) goto LAB_001c62ce;
    iVar3 = av1_cyclic_refresh_get_rdmult(cpi->cyclic_refresh);
  }
  else {
    if (iVar4 == 2) {
      uVar2 = *(ushort *)&mbmi->field_0xa7 & 7;
    }
    else {
      if (iVar4 != 1) goto LAB_001c62ce;
      if (cpi->vaq_refresh == 0) {
        uVar2 = *(ushort *)&mbmi->field_0xa7 & 7;
      }
      else {
        if (bsize < BLOCK_16X32) {
          uVar2 = x->mb_energy;
        }
        else {
          uVar2 = av1_log_block_var(cpi,x,bsize);
        }
        uVar2 = uVar2 & 7;
        *(ushort *)&mbmi->field_0xa7 = *(ushort *)&mbmi->field_0xa7 & 0xfff8 | (ushort)uVar2;
      }
    }
    iVar3 = set_rdmult(cpi,(MACROBLOCK *)(ulong)uVar2,(int)mbmi);
  }
  *rdmult = iVar3;
LAB_001c62ce:
  if (((cpi->common).delta_q_info.delta_q_present_flag != 0) &&
     ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0)) {
    iVar3 = av1_get_cb_rdmult(cpi,x,bsize,mi_row,mi_col);
    x->rdmult = iVar3;
  }
  aVar1 = (cpi->oxcf).tune_cfg.tuning;
  if ((aVar1 < (AOM_TUNE_BUTTERAUGLI|AOM_TUNE_VMAF_WITH_PREPROCESSING)) &&
     ((0xc02U >> (aVar1 & 0x1f) & 1) != 0)) {
    av1_set_ssim_rdmult(cpi,&x->errorperbit,bsize,mi_row,mi_col,rdmult);
    iVar3 = x->rdmult;
  }
  if ((cpi->oxcf).mode == '\x02') {
    iVar3 = (int)((ulong)((long)x->intra_sb_rdmult_modifier * (long)iVar3) >> 7);
  }
  iVar4 = 1;
  if (1 < iVar3) {
    iVar4 = iVar3;
  }
  *rdmult = iVar4;
  return;
}

Assistant:

static void setup_block_rdmult(const AV1_COMP *const cpi, MACROBLOCK *const x,
                               int mi_row, int mi_col, BLOCK_SIZE bsize,
                               AQ_MODE aq_mode, MB_MODE_INFO *mbmi) {
  x->rdmult = cpi->rd.RDMULT;

  if (aq_mode != NO_AQ) {
    assert(mbmi != NULL);
    if (aq_mode == VARIANCE_AQ) {
      if (cpi->vaq_refresh) {
        const int energy = bsize <= BLOCK_16X16
                               ? x->mb_energy
                               : av1_log_block_var(cpi, x, bsize);
        mbmi->segment_id = energy;
      }
      x->rdmult = set_rdmult(cpi, x, mbmi->segment_id);
    } else if (aq_mode == COMPLEXITY_AQ) {
      x->rdmult = set_rdmult(cpi, x, mbmi->segment_id);
    } else if (aq_mode == CYCLIC_REFRESH_AQ) {
      // If segment is boosted, use rdmult for that segment.
      if (cyclic_refresh_segment_id_boosted(mbmi->segment_id))
        x->rdmult = av1_cyclic_refresh_get_rdmult(cpi->cyclic_refresh);
    }
  }

#if !CONFIG_REALTIME_ONLY
  if (cpi->common.delta_q_info.delta_q_present_flag &&
      !cpi->sf.rt_sf.use_nonrd_pick_mode) {
    x->rdmult = av1_get_cb_rdmult(cpi, x, bsize, mi_row, mi_col);
  }
#endif  // !CONFIG_REALTIME_ONLY

  if (cpi->oxcf.tune_cfg.tuning == AOM_TUNE_SSIM ||
      cpi->oxcf.tune_cfg.tuning == AOM_TUNE_IQ ||
      cpi->oxcf.tune_cfg.tuning == AOM_TUNE_SSIMULACRA2) {
    av1_set_ssim_rdmult(cpi, &x->errorperbit, bsize, mi_row, mi_col,
                        &x->rdmult);
  }
#if CONFIG_SALIENCY_MAP
  else if (cpi->oxcf.tune_cfg.tuning == AOM_TUNE_VMAF_SALIENCY_MAP) {
    av1_set_saliency_map_vmaf_rdmult(cpi, &x->errorperbit,
                                     cpi->common.seq_params->sb_size, mi_row,
                                     mi_col, &x->rdmult);
  }
#endif
#if CONFIG_TUNE_VMAF
  else if (cpi->oxcf.tune_cfg.tuning == AOM_TUNE_VMAF_WITHOUT_PREPROCESSING ||
           cpi->oxcf.tune_cfg.tuning == AOM_TUNE_VMAF_MAX_GAIN ||
           cpi->oxcf.tune_cfg.tuning == AOM_TUNE_VMAF_NEG_MAX_GAIN) {
    av1_set_vmaf_rdmult(cpi, x, bsize, mi_row, mi_col, &x->rdmult);
  }
#endif
#if CONFIG_TUNE_BUTTERAUGLI
  else if (cpi->oxcf.tune_cfg.tuning == AOM_TUNE_BUTTERAUGLI) {
    av1_set_butteraugli_rdmult(cpi, x, bsize, mi_row, mi_col, &x->rdmult);
  }
#endif
  if (cpi->oxcf.mode == ALLINTRA) {
    x->rdmult = (int)(((int64_t)x->rdmult * x->intra_sb_rdmult_modifier) >> 7);
  }

  // Check to make sure that the adjustments above have not caused the
  // rd multiplier to be truncated to 0.
  x->rdmult = (x->rdmult > 0) ? x->rdmult : 1;
}